

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

bool D_AddFile(TArray<FString,_FString> *wadfiles,char *file,bool check,int position)

{
  bool bVar1;
  FString local_38;
  FString f;
  char *f_1;
  int position_local;
  bool check_local;
  char *file_local;
  TArray<FString,_FString> *wadfiles_local;
  
  if ((file == (char *)0x0) || (*file == '\0')) {
    wadfiles_local._7_1_ = false;
  }
  else {
    _position_local = file;
    if (((!check) || (bVar1 = DirEntryExists(file), bVar1)) ||
       (f.Chars = BaseFileSearch(file,".wad",false), _position_local = f.Chars,
       f.Chars != (char *)0x0)) {
      FString::FString(&local_38,_position_local);
      FixPathSeperator(&local_38);
      if (position == -1) {
        TArray<FString,_FString>::Push(wadfiles,&local_38);
      }
      else {
        TArray<FString,_FString>::Insert(wadfiles,position,&local_38);
      }
      wadfiles_local._7_1_ = true;
      FString::~FString(&local_38);
    }
    else {
      Printf("Can\'t find \'%s\'\n",file);
      wadfiles_local._7_1_ = false;
    }
  }
  return wadfiles_local._7_1_;
}

Assistant:

bool D_AddFile (TArray<FString> &wadfiles, const char *file, bool check, int position)
{
	if (file == NULL || *file == '\0')
	{
		return false;
	}

	if (check && !DirEntryExists (file))
	{
		const char *f = BaseFileSearch (file, ".wad");
		if (f == NULL)
		{
			Printf ("Can't find '%s'\n", file);
			return false;
		}
		file = f;
	}

	FString f = file;
	FixPathSeperator(f);
	if (position == -1) wadfiles.Push(f);
	else wadfiles.Insert(position, f);
	return true;
}